

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse_extra.c
# Opt level: O3

int mod2sparse_decomp_osd(mod2sparse *A,int R,mod2sparse *L,mod2sparse *U,int *rows,int *cols)

{
  uint n;
  uint n_00;
  int col;
  int iVar1;
  mod2entry *pmVar2;
  void *__ptr;
  mod2sparse *r;
  ulong uVar3;
  mod2entry *pmVar4;
  long lVar5;
  uint col_00;
  uint extraout_EDX;
  ulong uVar6;
  uint row;
  mod2entry *pmVar7;
  uint row_00;
  undefined4 in_register_00000034;
  mod2sparse *pmVar8;
  mod2entry *pmVar9;
  uint col_01;
  int local_84;
  mod2entry *extraout_RAX;
  
  lVar5 = CONCAT44(in_register_00000034,R);
  if (L->n_cols == R) {
    n = A->n_rows;
    if (L->n_rows == n) {
      n_00 = A->n_cols;
      if ((U->n_cols == n_00) && (U->n_rows == R)) {
        if (R <= (int)n_00) {
          pmVar2 = (mod2entry *)chk_alloc(n,4);
          __ptr = chk_alloc(n_00,4);
          mod2sparse_clear(L);
          mod2sparse_clear(U);
          r = mod2sparse_allocate(n,n_00);
          mod2sparse_copy(A,r);
          if (0 < (int)n) {
            uVar3 = 0;
            do {
              (&pmVar2->row)[uVar3] = (int)uVar3;
              rows[uVar3] = (int)uVar3;
              uVar3 = uVar3 + 1;
            } while (n != uVar3);
          }
          if (0 < (int)n_00) {
            uVar3 = 0;
            do {
              *(int *)((long)__ptr + (long)cols[uVar3] * 4) = (int)uVar3;
              uVar3 = uVar3 + 1;
            } while (n_00 != uVar3);
          }
          if (R < 1) {
            local_84 = 0;
          }
          else {
            pmVar4 = r->cols;
            uVar3 = 0;
            local_84 = 0;
            pmVar7 = pmVar2;
            do {
              col_01 = (uint)uVar3;
              uVar6 = uVar3;
              if ((long)uVar3 < (long)(int)n_00) {
                do {
                  for (pmVar7 = pmVar4[cols[uVar6]].down; -1 < pmVar7->row; pmVar7 = pmVar7->down) {
                    if ((long)uVar3 <= (long)(&pmVar2->row)[(uint)pmVar7->row]) {
                      if (*(int *)((long)__ptr + (long)pmVar7->col * 4) != (int)uVar6) {
                        printf("\n e: %i, k: %i");
                        printf("\nError. Exiting.");
                        exit(1);
                      }
                      cols[uVar6 & 0xffffffff] = cols[uVar3];
                      cols[uVar3] = pmVar7->col;
                      *(int *)((long)__ptr + (long)cols[uVar6 & 0xffffffff] * 4) = (int)uVar6;
                      *(uint *)((long)__ptr + (long)cols[uVar3] * 4) = col_01;
                      iVar1 = (&pmVar2->row)[pmVar7->row];
                      lVar5 = (long)iVar1;
                      if (lVar5 < (long)uVar3) {
                        abort();
                      }
                      rows[lVar5] = rows[uVar3];
                      rows[uVar3] = pmVar7->row;
                      (&pmVar2->row)[rows[lVar5]] = iVar1;
                      (&pmVar2->row)[rows[uVar3]] = col_01;
                      goto LAB_00120da9;
                    }
                  }
                  uVar6 = uVar6 + 1;
                } while (uVar6 != n_00);
              }
              local_84 = local_84 + 1;
LAB_00120da9:
              pmVar9 = pmVar4[cols[uVar3]].down;
              row = pmVar9->row;
              if (-1 < (int)row) {
                do {
                  pmVar9 = pmVar9->down;
                  row_00 = (&pmVar2->row)[row];
                  if ((long)uVar3 < (long)(int)row_00) {
                    mod2sparse_add_row(r,row,r,pmVar7->row);
                    pmVar8 = L;
                    col_00 = col_01;
                    row_00 = row;
                  }
                  else {
                    pmVar8 = U;
                    if ((long)(int)row_00 < (long)uVar3) {
                      col_00 = cols[uVar3];
                    }
                    else {
                      mod2sparse_insert(L,row,col_01);
                      col_00 = cols[uVar3];
                      row_00 = col_01;
                    }
                  }
                  mod2sparse_insert(pmVar8,row_00,col_00);
                  row = pmVar9->row;
                } while (-1 < (int)row);
                pmVar4 = r->cols;
                while (-1 < (pmVar4[cols[uVar3]].down)->row) {
                  mod2sparse_delete(r,pmVar4[cols[uVar3]].down);
                  pmVar4 = r->cols;
                }
              }
              uVar3 = uVar3 + 1;
            } while (uVar3 != (uint)R);
          }
          if ((int)n <= R) {
LAB_00120eb9:
            mod2sparse_free(r);
            free(pmVar2);
            free(__ptr);
            return local_84;
          }
          lVar5 = (long)R;
          do {
            while (pmVar7 = L->rows[rows[lVar5]].right, pmVar7->row < 0) {
              lVar5 = lVar5 + 1;
              if (n == (uint)lVar5) goto LAB_00120eb9;
            }
            mod2sparse_delete(L,pmVar7);
          } while( true );
        }
        goto LAB_00120f18;
      }
    }
  }
  mod2sparse_decomp_osd_cold_1();
LAB_00120f18:
  mod2sparse_decomp_osd_cold_2();
  if (((U->n_cols <= A->n_cols) || (U->n_rows < (int)extraout_EDX)) || (U->n_rows < A->n_rows)) {
    printf("mod2sparse_merge_vec: the receiving matrix doesn\'t have the good dimensions");
  }
  mod2sparse_copy(A,U);
  iVar1 = (int)extraout_RAX;
  if (0 < (int)extraout_EDX) {
    col = A->n_cols;
    uVar3 = 0;
    pmVar2 = extraout_RAX;
    do {
      if (*(char *)(lVar5 + uVar3) != '\0') {
        pmVar2 = mod2sparse_insert(U,(int)uVar3,col);
      }
      iVar1 = (int)pmVar2;
      uVar3 = uVar3 + 1;
    } while (extraout_EDX != uVar3);
  }
  return iVar1;
}

Assistant:

int mod2sparse_decomp_osd
        ( mod2sparse *A,	/* Input matrix, M by N */
          int R,		/* Size of sub-matrix to find LU decomposition of */
          mod2sparse *L,	/* Matrix in which L is stored, M by R */
          mod2sparse *U,	/* Matrix in which U is stored, R by N */
          int *rows,		/* Array where row indexes are stored, M long */
          int *cols		/* Array where column indexes are stored, N long */
        )
{

    int abandon_number=0;  	/* Number of columns to abandon at some point *//* When to abandon these columns */
    int abandon_when=0;
    mod2sparse_strategy strategy =Mod2sparse_first;/* Strategy to follow in picking rows/columns */

    int *rinv, *cinv, *acnt, *rcnt;
    mod2sparse *B;
    int M, N;

    mod2entry *e, *f, *fn, *e2;
    int i, j, k, cc, cc2, cc3, cr2, pr;
    int found, nnf;

    M = mod2sparse_rows(A);
    N = mod2sparse_cols(A);

    if (mod2sparse_cols(L)!=R || mod2sparse_rows(L)!=M
        || mod2sparse_cols(U)!=N || mod2sparse_rows(U)!=R)
    { fprintf (stderr,
               "mod2sparse_decomp: Matrices have incompatible dimensions\n");
        exit(1);
    }

    if (abandon_number>N-R)
    { fprintf(stderr,"Trying to abandon more columns than allowed\n");
        exit(1);
    }

    rinv = chk_alloc (M, sizeof *rinv);
    cinv = chk_alloc (N, sizeof *cinv);

    if (abandon_number>0)
    { acnt = chk_alloc (M+1, sizeof *acnt);
    }

    if (strategy==Mod2sparse_minprod)
    { rcnt = chk_alloc (M, sizeof *rcnt);
    }


    //these are the problematic functions!
    mod2sparse_clear(L);
    mod2sparse_clear(U);

    /* Copy A to B.  B will be modified, then discarded. */

    B = mod2sparse_allocate(M,N);
    mod2sparse_copy(A,B);

    /* Count 1s in rows of B, if using minprod strategy. */

    if (strategy==Mod2sparse_minprod)
    { for (i = 0; i<M; i++)
        { rcnt[i] = mod2sparse_count_row(B,i);
        }
    }

    /* Set up initial row and column choices. */

    for (i = 0; i<M; i++) rows[i] = rinv[i] = i;
    for (j = 0; j<N; j++) {

        cinv[cols[j]]=j;

    }
    /* Find L and U one column at a time. */

    nnf = 0;

    for (i = 0; i<R; i++)
    {
        /* Choose the next row and column of B. */

        switch (strategy)
        {
            case Mod2sparse_first:
            {
                found = 0;

                for (k = i; k<N; k++)
                { e = mod2sparse_first_in_col(B,cols[k]);
                    while (!mod2sparse_at_end(e))
                    { if (rinv[mod2sparse_row(e)]>=i)
                        { found = 1;
                            goto out_first;
                        }
                        e = mod2sparse_next_in_col(e);
                    }
                }

                out_first:
                break;
            }

            case Mod2sparse_mincol:
            {
                found = 0;

                for (j = i; j<N; j++)
                { cc2 = mod2sparse_count_col(B,cols[j]);
                    if (!found || cc2<cc)
                    { e2 = mod2sparse_first_in_col(B,cols[j]);
                        while (!mod2sparse_at_end(e2))
                        { if (rinv[mod2sparse_row(e2)]>=i)
                            { found = 1;
                                cc = cc2;
                                e = e2;
                                k = j;
                                break;
                            }
                            e2 = mod2sparse_next_in_col(e2);
                        }
                    }
                }

                break;
            }

            case Mod2sparse_minprod:
            {
                found = 0;

                for (j = i; j<N; j++)
                { cc2 = mod2sparse_count_col(B,cols[j]);
                    e2 = mod2sparse_first_in_col(B,cols[j]);
                    while (!mod2sparse_at_end(e2))
                    { if (rinv[mod2sparse_row(e2)]>=i)
                        { cr2 = rcnt[mod2sparse_row(e2)];
                            if (!found || cc2==1 || (cc2-1)*(cr2-1)<pr)
                            { found = 1;
                                pr = cc2==1 ? 0 : (cc2-1)*(cr2-1);
                                e = e2;
                                k = j;
                            }
                        }
                        e2 = mod2sparse_next_in_col(e2);
                    }
                }

                break;
            }

            default:
            { fprintf(stderr,"mod2sparse_decomp: Unknown stategy\n");
                exit(1);
            }
        }

        if (!found)
        { nnf += 1;
        }



        /* Update 'rows' and 'cols'.  Looks at 'k' and 'e' found above. */

        if (found)
        {
            // if (cinv[mod2sparse_col(e)]!=k) abort();
            if (cinv[mod2sparse_col(e)]!=k){
                printf("\n e: %i, k: %i",mod2sparse_col(e),k);
                printf("\nError. Exiting.");
                exit(1);
            }


            cols[k] = cols[i];
            cols[i] = mod2sparse_col(e);

            cinv[cols[k]] = k;
            cinv[cols[i]] = i;

            k = rinv[mod2sparse_row(e)];

            if (k<i) abort();

            rows[k] = rows[i];
            rows[i] = mod2sparse_row(e);

            rinv[rows[k]] = k;
            rinv[rows[i]] = i;
        }



        /* Update L, U, and B. */

        f = mod2sparse_first_in_col(B,cols[i]);

        while (!mod2sparse_at_end(f))
        {
            fn = mod2sparse_next_in_col(f);
            k = mod2sparse_row(f);
            if (rinv[k]>i)
            { mod2sparse_add_row(B,k,B,mod2sparse_row(e));
                if (strategy==Mod2sparse_minprod)
                { rcnt[k] = mod2sparse_count_row(B,k);
                }
                mod2sparse_insert(L,k,i);
            }
            else if (rinv[k]<i)
            { mod2sparse_insert(U,rinv[k],cols[i]);
            }
            else
            { mod2sparse_insert(L,k,i);
                mod2sparse_insert(U,i,cols[i]);
            }

            f = fn;
        }


        /* Get rid of all entries in the current column of B, just to save space. */

        for (;;)
        { f = mod2sparse_first_in_col(B,cols[i]);
            if (mod2sparse_at_end(f)) break;
            mod2sparse_delete(B,f);
        }

        /* Abandon columns of B with lots of entries if it's time for that. */

        if (abandon_number>0 && i==abandon_when)
        {
            for (k = 0; k<M+1; k++)
            { acnt[k] = 0;
            }
            for (j = 0; j<N; j++)
            { k = mod2sparse_count_col(B,j);
                acnt[k] += 1;
            }

            cc = abandon_number;
            k = M;
            while (acnt[k]<cc)
            { cc -= acnt[k];
                k -= 1;
                if (k<0) abort();
            }

            cc2 = 0;
            for (j = 0; j<N; j++)
            { cc3 = mod2sparse_count_col(B,j);
                if (cc3>k || cc3==k && cc>0)
                { if (cc3==k) cc -= 1;
                    for (;;)
                    { f = mod2sparse_first_in_col(B,j);
                        if (mod2sparse_at_end(f)) break;
                        mod2sparse_delete(B,f);
                    }
                    cc2 += 1;
                }
            }

            if (cc2!=abandon_number) abort();

            if (strategy==Mod2sparse_minprod)
            { for (j = 0; j<M; j++)
                { rcnt[j] = mod2sparse_count_row(B,j);
                }
            }
        }
    }

    /* Get rid of all entries in the rows of L past row R, after reordering. */

    for (i = R; i<M; i++)
    { for (;;)
        { f = mod2sparse_first_in_row(L,rows[i]);
            if (mod2sparse_at_end(f)) break;
            mod2sparse_delete(L,f);
        }
    }

    mod2sparse_free(B);
    free(rinv);
    free(cinv);
    if (strategy==Mod2sparse_minprod) free(rcnt);
    if (abandon_number>0) free(acnt);

    return nnf;
}